

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboApiTest.cpp
# Opt level: O0

void deqp::gles2::Functional::deleteTexCubeAttachedToBoundFboTest(TestContext *testCtx,Context *ctx)

{
  uint local_1c;
  Context *pCStack_18;
  deUint32 texCube;
  Context *ctx_local;
  TestContext *testCtx_local;
  
  pCStack_18 = ctx;
  ctx_local = (Context *)testCtx;
  (*ctx->_vptr_Context[9])(ctx,0x8d40,1);
  local_1c = 1;
  (*pCStack_18->_vptr_Context[6])(pCStack_18,0x8513,1);
  (*pCStack_18->_vptr_Context[0x1e])(pCStack_18,0x8d40,0x8d00,0x8515,(ulong)local_1c,0);
  checkFboAttachmentParam((TestContext *)ctx_local,pCStack_18,0x8d00,0x8cd0,0x1702);
  checkFboAttachmentParam((TestContext *)ctx_local,pCStack_18,0x8d00,0x8cd1,local_1c);
  (*pCStack_18->_vptr_Context[8])(pCStack_18,1,&local_1c);
  checkFboAttachmentParam((TestContext *)ctx_local,pCStack_18,0x8d00,0x8cd0,0);
  return;
}

Assistant:

static void deleteTexCubeAttachedToBoundFboTest (tcu::TestContext& testCtx, sglr::Context& ctx)
{
	ctx.bindFramebuffer(GL_FRAMEBUFFER, 1);

	deUint32 texCube = 1;
	ctx.bindTexture(GL_TEXTURE_CUBE_MAP, texCube);
	ctx.framebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_CUBE_MAP_POSITIVE_X, texCube, 0);

	checkFboAttachmentParam(testCtx, ctx, GL_DEPTH_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, GL_TEXTURE);
	checkFboAttachmentParam(testCtx, ctx, GL_DEPTH_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME, texCube);

	ctx.deleteTextures(1, &texCube);

	checkFboAttachmentParam(testCtx, ctx, GL_DEPTH_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, GL_NONE);
}